

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall cfd::js::api::json::FundPsbtRequest::~FundPsbtRequest(FundPsbtRequest *this)

{
  (this->super_JsonClassBase<cfd::js::api::json::FundPsbtRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__FundPsbtRequest_00b41098;
  FundFeeInformation::~FundFeeInformation(&this->fee_info_);
  std::__cxx11::string::~string((string *)&this->reserved_descriptor_);
  std::__cxx11::string::~string((string *)&this->network_);
  std::
  vector<cfd::js::api::json::FundUtxoJsonData,_std::allocator<cfd::js::api::json::FundUtxoJsonData>_>
  ::~vector(&(this->utxos_).super_JsonVector<cfd::js::api::json::FundUtxoJsonData>.
             super_vector<cfd::js::api::json::FundUtxoJsonData,_std::allocator<cfd::js::api::json::FundUtxoJsonData>_>
           );
  std::__cxx11::string::~string((string *)&this->psbt_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->ignore_items)._M_t);
  return;
}

Assistant:

virtual ~FundPsbtRequest() {
    // do nothing
  }